

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StartThreadP33xx(P33X *pP33x)

{
  int iVar1;
  int local_1c;
  int id;
  P33X *pP33x_local;
  
  local_1c = 0;
  do {
    if ((P33X *)addrsP33x[local_1c] == pP33x) {
      resP33x[local_1c] = 1;
      bExitP33x[local_1c] = 0;
      InitCriticalSection(P33xCS + local_1c);
      iVar1 = CreateDefaultThread(P33xThread,pP33x,P33xThreadId + local_1c);
      return iVar1;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadP33xx(P33X* pP33x)
{
	int id = 0;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resP33x[id] = EXIT_FAILURE;
	bExitP33x[id] = FALSE;
	InitCriticalSection(&P33xCS[id]);
	return CreateDefaultThread(P33xThread, (void*)pP33x, &P33xThreadId[id]);
}